

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_pipeline
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  uint _h;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  int iVar9;
  Layer *pLVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  ParamDict pd;
  Mat local_68;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar10 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_68);
    break;
  case 2:
    pLVar10 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_68);
    break;
  case 3:
    pLVar10 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_68,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_68);
    break;
  case 4:
    pLVar10 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_68);
    break;
  case 5:
    pLVar10 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_68);
    break;
  case 6:
    pLVar10 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_68,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_68);
    break;
  default:
    pLVar10 = (Layer *)0x0;
    goto LAB_003fc3b6;
  }
  ParamDict::~ParamDict((ParamDict *)&local_68);
  (*pLVar10->_vptr_Layer[4])(pLVar10,opt);
LAB_003fc3b6:
  this->activation = pLVar10;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar8._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
  uVar8._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar8;
  auVar7 = vpshufd_avx(auVar11,0x55);
  auVar7 = vpmulld_avx(auVar7,auVar11);
  iVar13 = auVar7._0_4_;
  uVar1 = (this->super_ConvolutionDepthWise).num_output;
  _h = (this->super_ConvolutionDepthWise).group;
  uVar6 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)_h;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar13;
  if ((_h == uVar1) &&
     ((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
           (long)((int)uVar1 / (int)_h)) * _h == _h)) {
    if (opt->use_packing_layout == true) {
      if ((_h & 0xf) == 0) {
        Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,iVar13,_h,
                     (Allocator *)0x0);
        convert_packing(&local_68,&this->weight_data_tm,0x10,opt);
        if (local_68.refcount == (int *)0x0) goto LAB_003fc6a7;
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount != 0) goto LAB_003fc6a7;
        if (local_68.allocator != (Allocator *)0x0) {
          (*(local_68.allocator)->_vptr_Allocator[3])();
          goto LAB_003fc6a7;
        }
      }
      else if ((_h & 7) == 0) {
        Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,iVar13,_h,
                     (Allocator *)0x0);
        convert_packing(&local_68,&this->weight_data_tm,8,opt);
        if (local_68.refcount == (int *)0x0) goto LAB_003fc6a7;
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount != 0) goto LAB_003fc6a7;
        if (local_68.allocator != (Allocator *)0x0) {
          (*(local_68.allocator)->_vptr_Allocator[3])();
          goto LAB_003fc6a7;
        }
      }
      else {
        if ((_h & 3) != 0) goto LAB_003fc453;
        Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,iVar13,_h,
                     (Allocator *)0x0);
        convert_packing(&local_68,&this->weight_data_tm,4,opt);
        if (local_68.refcount == (int *)0x0) goto LAB_003fc6a7;
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount != 0) goto LAB_003fc6a7;
        if (local_68.allocator != (Allocator *)0x0) {
          (*(local_68.allocator)->_vptr_Allocator[3])();
          goto LAB_003fc6a7;
        }
      }
      if (local_68.data != (void *)0x0) {
        free(local_68.data);
      }
      goto LAB_003fc6a7;
    }
LAB_003fc453:
    auVar7._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar7._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar7._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
    auVar7._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar8;
    auVar7 = vpunpcklqdq_avx(auVar12,auVar7);
    uVar8 = vpcmpd_avx512vl(auVar7,_DAT_005c3380,4);
    iVar13 = (this->super_ConvolutionDepthWise).stride_w;
    iVar2 = (this->super_ConvolutionDepthWise).stride_h;
    if (((iVar2 == 1 && iVar13 == 1) && (uVar8 & 0xf) == 0) ||
       ((iVar2 == 2 && iVar13 == 2) && (uVar8 & 0xf) == 0)) {
      piVar3 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_tm).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data_tm).data;
          pAVar5 = (this->weight_data_tm).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar3;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar13 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar2 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar9 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar13;
      (this->weight_data_tm).h = iVar2;
      (this->weight_data_tm).d = iVar9;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_003fc6a7;
    }
  }
  create_group_ops(this,opt);
LAB_003fc6a7:
  if (opt->lightmode == true) {
    piVar3 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_ConvolutionDepthWise).weight_data.data;
        pAVar5 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}